

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

bool Imf_2_5::isValidCompression(Compression c)

{
  return c < NUM_COMPRESSION_METHODS;
}

Assistant:

bool	
isValidCompression (Compression c)
{
    switch (c)
    {
      case NO_COMPRESSION:
      case RLE_COMPRESSION:
      case ZIPS_COMPRESSION:
      case ZIP_COMPRESSION:
      case PIZ_COMPRESSION:
      case PXR24_COMPRESSION:
      case B44_COMPRESSION:
      case B44A_COMPRESSION:
      case DWAA_COMPRESSION:
      case DWAB_COMPRESSION:

	return true;

      default:

	return false;
    }
}